

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compressBegin_usingDict(ZSTD_CCtx *cctx,void *dict,size_t dictSize,int compressionLevel)

{
  ZSTD_format_e ZVar1;
  ZSTD_CCtx_params params_00;
  size_t sVar2;
  long lVar3;
  ZSTD_CCtx_params *pZVar4;
  undefined8 *puVar5;
  byte bVar6;
  ZSTD_parameters params;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined8 in_stack_fffffffffffffe80;
  undefined1 auVar7 [12];
  undefined1 auVar8 [24];
  undefined1 in_stack_fffffffffffffe88 [112];
  undefined1 auVar9 [24];
  ZSTD_compressionParameters local_d8;
  int iStack_bc;
  int iStack_b8;
  int iStack_b4;
  ZSTD_CCtx_params local_b0;
  
  bVar6 = 0;
  ZSTD_getCParams(&local_d8,compressionLevel,0xffffffffffffffff,dictSize);
  iStack_b8 = 0;
  iStack_b4 = 0;
  iStack_bc = 1;
  ZVar1 = (cctx->requestedParams).format;
  memcpy(&local_b0.forceWindow,&(cctx->requestedParams).forceWindow,0x50);
  local_b0.format = ZVar1;
  local_b0.cParams.windowLog = local_d8.windowLog;
  local_b0.cParams.chainLog = local_d8.chainLog;
  local_b0.cParams.hashLog = local_d8.hashLog;
  local_b0.cParams.searchLog = local_d8.searchLog;
  local_b0.cParams.minMatch = local_d8.minMatch;
  local_b0.fParams.noDictIDFlag = iStack_b4;
  local_b0.cParams.targetLength = local_d8.targetLength;
  local_b0.cParams.strategy = local_d8.strategy;
  local_b0.fParams.contentSizeFlag = iStack_bc;
  local_b0.fParams.checksumFlag = iStack_b8;
  local_b0.compressionLevel = 3;
  pZVar4 = &local_b0;
  puVar5 = (undefined8 *)&stack0xfffffffffffffe78;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = *(undefined8 *)pZVar4;
    pZVar4 = (ZSTD_CCtx_params *)((long)pZVar4 + ((ulong)bVar6 * -2 + 1) * 8);
    puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
  }
  params_00.cParams.windowLog = in_stack_fffffffffffffe7c;
  params_00.format = in_stack_fffffffffffffe78;
  params_00.cParams.chainLog = (int)in_stack_fffffffffffffe80;
  params_00.cParams.hashLog = (int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  auVar7 = in_stack_fffffffffffffe88._16_12_;
  auVar8 = in_stack_fffffffffffffe88._64_24_;
  auVar9 = in_stack_fffffffffffffe88._88_24_;
  params_00.cParams.searchLog = in_stack_fffffffffffffe88._0_4_;
  params_00.cParams.minMatch = in_stack_fffffffffffffe88._4_4_;
  params_00.cParams.targetLength = in_stack_fffffffffffffe88._8_4_;
  params_00.cParams.strategy = in_stack_fffffffffffffe88._12_4_;
  params_00.fParams.contentSizeFlag = auVar7._0_4_;
  params_00.fParams.checksumFlag = auVar7._4_4_;
  params_00.fParams.noDictIDFlag = auVar7._8_4_;
  params_00.compressionLevel = in_stack_fffffffffffffe88._28_4_;
  params_00.forceWindow = in_stack_fffffffffffffe88._32_4_;
  params_00.attachDictPref = in_stack_fffffffffffffe88._36_4_;
  params_00.nbWorkers = in_stack_fffffffffffffe88._40_4_;
  params_00._60_4_ = in_stack_fffffffffffffe88._44_4_;
  params_00.jobSize = in_stack_fffffffffffffe88._48_8_;
  params_00.overlapLog = in_stack_fffffffffffffe88._56_4_;
  params_00.rsyncable = in_stack_fffffffffffffe88._60_4_;
  params_00.ldmParams.enableLdm = auVar8._0_4_;
  params_00.ldmParams.hashLog = auVar8._4_4_;
  params_00.ldmParams.bucketSizeLog = auVar8._8_4_;
  params_00.ldmParams.minMatchLength = auVar8._12_4_;
  params_00.ldmParams.hashRateLog = auVar8._16_4_;
  params_00.ldmParams.windowLog = auVar8._20_4_;
  params_00.customMem.customAlloc = (ZSTD_allocFunction)auVar9._0_8_;
  params_00.customMem.customFree = (ZSTD_freeFunction)auVar9._8_8_;
  params_00.customMem.opaque = (void *)auVar9._16_8_;
  sVar2 = ZSTD_resetCCtx_internal
                    (cctx,params_00,0xffffffffffffffff,ZSTDcrp_continue,ZSTDb_not_buffered);
  if (sVar2 < 0xffffffffffffff89) {
    sVar2 = ZSTD_compress_insertDictionary
                      ((cctx->blockState).prevCBlock,&(cctx->blockState).matchState,&local_b0,dict,
                       dictSize,ZSTD_dct_auto,ZSTD_dtlm_fast,cctx->entropyWorkspace);
    if (sVar2 < 0xffffffffffffff89) {
      cctx->dictID = (U32)sVar2;
      sVar2 = 0;
    }
  }
  return sVar2;
}

Assistant:

size_t ZSTD_compressBegin_usingDict(ZSTD_CCtx* cctx, const void* dict, size_t dictSize, int compressionLevel)
{
    ZSTD_parameters const params = ZSTD_getParams(compressionLevel, ZSTD_CONTENTSIZE_UNKNOWN, dictSize);
    ZSTD_CCtx_params const cctxParams =
            ZSTD_assignParamsToCCtxParams(cctx->requestedParams, params);
    DEBUGLOG(4, "ZSTD_compressBegin_usingDict (dictSize=%u)", (unsigned)dictSize);
    return ZSTD_compressBegin_internal(cctx, dict, dictSize, ZSTD_dct_auto, ZSTD_dtlm_fast, NULL,
                                       cctxParams, ZSTD_CONTENTSIZE_UNKNOWN, ZSTDb_not_buffered);
}